

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

Real * MatrixDeterminant(Real *__return_storage_ptr__,Matrix *a)

{
  int iVar1;
  undefined4 extraout_var;
  Real *pRVar2;
  
  iVar1 = *(int *)__return_storage_ptr__;
  if ((iVar1 == *(int *)((long)__return_storage_ptr__ + 4)) && (0xfffffffa < iVar1 - 6U)) {
    pRVar2 = *(Real **)((long)__return_storage_ptr__ + 8);
    switch(iVar1) {
    case 1:
      break;
    case 2:
      break;
    case 3:
      break;
    case 4:
      break;
    case 5:
    }
  }
  else {
    iVar1 = fprintf(_stderr,"%s: Unsupported dimension (%dx%d)\n","MatrixDeterminant");
    pRVar2 = (Real *)CONCAT44(extraout_var,iVar1);
  }
  return pRVar2;
}

Assistant:

Real MatrixDeterminant(const Matrix *a) {
#ifndef NDEBUG
  if (a->rows != a->columns || a->rows == 0 || a->rows > 5) {
    fprintf(stderr, "%s: Unsupported dimension (%dx%d)\n", __FUNCTION_NAME__, a->rows, a->columns);
    return 0;
  }
#endif
  Real *m = a->matrix;
  switch (a->rows) {
  case 1:
    return m[0];
  case 2:
    return -m[1] * m[2] + m[0] * m[3];
  case 3:
    return -m[2] * m[4] * m[6] + m[1] * m[5] * m[6] + m[2] * m[3] * m[7] - m[0] * m[5] * m[7] - m[1] * m[3] * m[8] + m[0] * m[4] * m[8];
  case 4:
    return m[1] * m[7] * m[10] * m[12] - m[1] * m[6] * m[11] * m[12] - m[0] * m[7] * m[10] * m[13] + m[0] * m[6] * m[11] * m[13] - m[1] * m[7] * m[8] * m[14] + m[0] * m[7] * m[9] * m[14] +
           m[1] * m[4] * m[11] * m[14] - m[0] * m[5] * m[11] * m[14] +
           m[3] * (m[6] * m[9] * m[12] - m[5] * m[10] * m[12] - m[6] * m[8] * m[13] + m[4] * m[10] * m[13] + m[5] * m[8] * m[14] - m[4] * m[9] * m[14]) +
           (m[1] * m[6] * m[8] - m[0] * m[6] * m[9] - m[1] * m[4] * m[10] + m[0] * m[5] * m[10]) * m[15] +
           m[2] * (-m[7] * m[9] * m[12] + m[5] * m[11] * m[12] + m[7] * m[8] * m[13] - m[4] * m[11] * m[13] - m[5] * m[8] * m[15] + m[4] * m[9] * m[15]);
  case 5:
    return m[2] * m[9] * m[13] * m[16] * m[20] - m[2] * m[8] * m[14] * m[16] * m[20] - m[1] * m[9] * m[13] * m[17] * m[20] + m[1] * m[8] * m[14] * m[17] * m[20] - m[2] * m[9] * m[11] * m[18] * m[20] +
           m[1] * m[9] * m[12] * m[18] * m[20] + m[2] * m[6] * m[14] * m[18] * m[20] - m[1] * m[7] * m[14] * m[18] * m[20] + m[2] * m[8] * m[11] * m[19] * m[20] - m[1] * m[8] * m[12] * m[19] * m[20] -
           m[2] * m[6] * m[13] * m[19] * m[20] + m[1] * m[7] * m[13] * m[19] * m[20] - m[2] * m[9] * m[13] * m[15] * m[21] + m[2] * m[8] * m[14] * m[15] * m[21] + m[0] * m[9] * m[13] * m[17] * m[21] -
           m[0] * m[8] * m[14] * m[17] * m[21] + m[2] * m[9] * m[10] * m[18] * m[21] - m[0] * m[9] * m[12] * m[18] * m[21] - m[2] * m[5] * m[14] * m[18] * m[21] + m[0] * m[7] * m[14] * m[18] * m[21] -
           m[2] * m[8] * m[10] * m[19] * m[21] + m[0] * m[8] * m[12] * m[19] * m[21] + m[2] * m[5] * m[13] * m[19] * m[21] - m[0] * m[7] * m[13] * m[19] * m[21] + m[1] * m[9] * m[13] * m[15] * m[22] -
           m[1] * m[8] * m[14] * m[15] * m[22] - m[0] * m[9] * m[13] * m[16] * m[22] + m[0] * m[8] * m[14] * m[16] * m[22] - m[1] * m[9] * m[10] * m[18] * m[22] + m[0] * m[9] * m[11] * m[18] * m[22] +
           m[1] * m[5] * m[14] * m[18] * m[22] - m[0] * m[6] * m[14] * m[18] * m[22] + m[1] * m[8] * m[10] * m[19] * m[22] - m[0] * m[8] * m[11] * m[19] * m[22] - m[1] * m[5] * m[13] * m[19] * m[22] +
           m[0] * m[6] * m[13] * m[19] * m[22] + m[2] * m[9] * m[11] * m[15] * m[23] - m[1] * m[9] * m[12] * m[15] * m[23] - m[2] * m[6] * m[14] * m[15] * m[23] + m[1] * m[7] * m[14] * m[15] * m[23] -
           m[2] * m[9] * m[10] * m[16] * m[23] + m[0] * m[9] * m[12] * m[16] * m[23] + m[2] * m[5] * m[14] * m[16] * m[23] - m[0] * m[7] * m[14] * m[16] * m[23] + m[1] * m[9] * m[10] * m[17] * m[23] -
           m[0] * m[9] * m[11] * m[17] * m[23] - m[1] * m[5] * m[14] * m[17] * m[23] + m[0] * m[6] * m[14] * m[17] * m[23] + m[2] * m[6] * m[10] * m[19] * m[23] - m[1] * m[7] * m[10] * m[19] * m[23] -
           m[2] * m[5] * m[11] * m[19] * m[23] + m[0] * m[7] * m[11] * m[19] * m[23] + m[1] * m[5] * m[12] * m[19] * m[23] - m[0] * m[6] * m[12] * m[19] * m[23] +
           m[4] * (m[6] * m[13] * m[17] * m[20] - m[6] * m[12] * m[18] * m[20] - m[5] * m[13] * m[17] * m[21] + m[5] * m[12] * m[18] * m[21] - m[6] * m[13] * m[15] * m[22] +
                   m[5] * m[13] * m[16] * m[22] + m[6] * m[10] * m[18] * m[22] - m[5] * m[11] * m[18] * m[22] +
                   m[8] * (m[12] * m[16] * m[20] - m[11] * m[17] * m[20] - m[12] * m[15] * m[21] + m[10] * m[17] * m[21] + m[11] * m[15] * m[22] - m[10] * m[16] * m[22]) +
                   (m[6] * m[12] * m[15] - m[5] * m[12] * m[16] - m[6] * m[10] * m[17] + m[5] * m[11] * m[17]) * m[23] +
                   m[7] * (-m[13] * m[16] * m[20] + m[11] * m[18] * m[20] + m[13] * m[15] * m[21] - m[10] * m[18] * m[21] - m[11] * m[15] * m[23] + m[10] * m[16] * m[23])) +
           (m[2] * (-m[8] * m[11] * m[15] + m[6] * m[13] * m[15] + m[8] * m[10] * m[16] - m[5] * m[13] * m[16] - m[6] * m[10] * m[18] + m[5] * m[11] * m[18]) +
            m[1] * (m[8] * m[12] * m[15] - m[7] * m[13] * m[15] - m[8] * m[10] * m[17] + m[5] * m[13] * m[17] + m[7] * m[10] * m[18] - m[5] * m[12] * m[18]) +
            m[0] * (-m[8] * m[12] * m[16] + m[7] * m[13] * m[16] + m[8] * m[11] * m[17] - m[6] * m[13] * m[17] - m[7] * m[11] * m[18] + m[6] * m[12] * m[18])) *
               m[24] +
           m[3] * (-m[6] * m[14] * m[17] * m[20] + m[6] * m[12] * m[19] * m[20] + m[5] * m[14] * m[17] * m[21] - m[5] * m[12] * m[19] * m[21] + m[6] * m[14] * m[15] * m[22] -
                   m[5] * m[14] * m[16] * m[22] - m[6] * m[10] * m[19] * m[22] + m[5] * m[11] * m[19] * m[22] +
                   m[9] * (-m[12] * m[16] * m[20] + m[11] * m[17] * m[20] + m[12] * m[15] * m[21] - m[10] * m[17] * m[21] - m[11] * m[15] * m[22] + m[10] * m[16] * m[22]) -
                   m[6] * m[12] * m[15] * m[24] + m[5] * m[12] * m[16] * m[24] + m[6] * m[10] * m[17] * m[24] - m[5] * m[11] * m[17] * m[24] +
                   m[7] * (m[14] * m[16] * m[20] - m[11] * m[19] * m[20] - m[14] * m[15] * m[21] + m[10] * m[19] * m[21] + m[11] * m[15] * m[24] - m[10] * m[16] * m[24]));
  default:
    fprintf(stderr, "%s: Unsupported dimension (%dx%d). BUG!\n", __FUNCTION_NAME__, a->rows, a->columns);
    return 0;
  }
}